

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int s_sha512_compress(sha512_state *md,uchar *buf)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int local_2ec;
  int i;
  ulong64 t1;
  ulong64 t0;
  ulong64 W [80];
  ulong64 S [8];
  uchar *buf_local;
  sha512_state *md_local;
  
  for (local_2ec = 0; local_2ec < 8; local_2ec = local_2ec + 1) {
    W[(long)local_2ec + 0x4f] = md->state[local_2ec];
  }
  for (local_2ec = 0; local_2ec < 0x10; local_2ec = local_2ec + 1) {
    W[(long)local_2ec + -1] =
         (long)(int)(uint)buf[local_2ec << 3] << 0x38 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 1] << 0x30 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 2] << 0x28 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 3] << 0x20 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 4] << 0x18 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 5] << 0x10 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 6] << 8 |
         (long)(int)(uint)buf[(long)(local_2ec << 3) + 7];
  }
  for (local_2ec = 0x10; local_2ec < 0x50; local_2ec = local_2ec + 1) {
    W[(long)local_2ec + -1] =
         ((W[(long)(local_2ec + -2) + -1] >> 0x13 | W[(long)(local_2ec + -2) + -1] << 0x2d) ^
          (W[(long)(local_2ec + -2) + -1] >> 0x3d | W[(long)(local_2ec + -2) + -1] << 3) ^
         W[(long)(local_2ec + -2) + -1] >> 6) + W[(long)(local_2ec + -7) + -1] +
         ((W[(long)(local_2ec + -0xf) + -1] >> 1 | W[(long)(local_2ec + -0xf) + -1] << 0x3f) ^
          (W[(long)(local_2ec + -0xf) + -1] >> 8 | W[(long)(local_2ec + -0xf) + -1] << 0x38) ^
         W[(long)(local_2ec + -0xf) + -1] >> 7) + W[(long)(local_2ec + -0x10) + -1];
  }
  for (local_2ec = 0; local_2ec < 0x50; local_2ec = local_2ec + 8) {
    lVar1 = S[6] + ((S[3] >> 0xe | S[3] << 0x32) ^ (S[3] >> 0x12 | S[3] << 0x2e) ^
                   (S[3] >> 0x29 | S[3] << 0x17)) + (S[5] ^ S[3] & (S[4] ^ S[5])) + K[local_2ec] +
            W[(long)local_2ec + -1];
    uVar2 = lVar1 + S[2];
    uVar3 = lVar1 + ((W[0x4f] >> 0x1c | W[0x4f] << 0x24) ^ (W[0x4f] >> 0x22 | W[0x4f] << 0x1e) ^
                    (W[0x4f] >> 0x27 | W[0x4f] << 0x19)) +
                    ((W[0x4f] | S[0]) & S[1] | W[0x4f] & S[0]);
    lVar1 = S[5] + ((uVar2 >> 0xe | uVar2 << 0x32) ^ (uVar2 >> 0x12 | uVar2 << 0x2e) ^
                   (uVar2 >> 0x29 | uVar2 * 0x800000)) + (S[4] ^ uVar2 & (S[3] ^ S[4])) +
            K[local_2ec + 1] + W[(long)(local_2ec + 1) + -1];
    uVar4 = lVar1 + S[1];
    uVar5 = lVar1 + ((uVar3 >> 0x1c | uVar3 << 0x24) ^ (uVar3 >> 0x22 | uVar3 * 0x40000000) ^
                    (uVar3 >> 0x27 | uVar3 * 0x2000000)) +
                    ((uVar3 | W[0x4f]) & S[0] | uVar3 & W[0x4f]);
    lVar1 = S[4] + ((uVar4 >> 0xe | uVar4 << 0x32) ^ (uVar4 >> 0x12 | uVar4 << 0x2e) ^
                   (uVar4 >> 0x29 | uVar4 * 0x800000)) + (S[3] ^ uVar4 & (uVar2 ^ S[3])) +
            K[local_2ec + 2] + W[(long)(local_2ec + 2) + -1];
    uVar6 = lVar1 + S[0];
    uVar7 = lVar1 + ((uVar5 >> 0x1c | uVar5 << 0x24) ^ (uVar5 >> 0x22 | uVar5 * 0x40000000) ^
                    (uVar5 >> 0x27 | uVar5 * 0x2000000)) +
                    ((uVar5 | uVar3) & W[0x4f] | uVar5 & uVar3);
    lVar1 = S[3] + ((uVar6 >> 0xe | uVar6 << 0x32) ^ (uVar6 >> 0x12 | uVar6 << 0x2e) ^
                   (uVar6 >> 0x29 | uVar6 * 0x800000)) + (uVar2 ^ uVar6 & (uVar4 ^ uVar2)) +
            K[local_2ec + 3] + W[(long)(local_2ec + 3) + -1];
    W[0x4f] = lVar1 + W[0x4f];
    uVar8 = lVar1 + ((uVar7 >> 0x1c | uVar7 << 0x24) ^ (uVar7 >> 0x22 | uVar7 * 0x40000000) ^
                    (uVar7 >> 0x27 | uVar7 * 0x2000000)) + ((uVar7 | uVar5) & uVar3 | uVar7 & uVar5)
    ;
    lVar1 = uVar2 + ((W[0x4f] >> 0xe | W[0x4f] << 0x32) ^ (W[0x4f] >> 0x12 | W[0x4f] << 0x2e) ^
                    (W[0x4f] >> 0x29 | W[0x4f] * 0x800000)) + (uVar4 ^ W[0x4f] & (uVar6 ^ uVar4)) +
            K[local_2ec + 4] + W[(long)(local_2ec + 4) + -1];
    S[6] = lVar1 + uVar3;
    S[2] = lVar1 + ((uVar8 >> 0x1c | uVar8 << 0x24) ^ (uVar8 >> 0x22 | uVar8 * 0x40000000) ^
                   (uVar8 >> 0x27 | uVar8 * 0x2000000)) + ((uVar8 | uVar7) & uVar5 | uVar8 & uVar7);
    lVar1 = uVar4 + ((S[6] >> 0xe | S[6] << 0x32) ^ (S[6] >> 0x12 | S[6] << 0x2e) ^
                    (S[6] >> 0x29 | S[6] * 0x800000)) + (uVar6 ^ S[6] & (W[0x4f] ^ uVar6)) +
            K[local_2ec + 5] + W[(long)(local_2ec + 5) + -1];
    S[5] = lVar1 + uVar5;
    S[1] = lVar1 + ((S[2] >> 0x1c | S[2] << 0x24) ^ (S[2] >> 0x22 | S[2] * 0x40000000) ^
                   (S[2] >> 0x27 | S[2] * 0x2000000)) + ((S[2] | uVar8) & uVar7 | S[2] & uVar8);
    lVar1 = uVar6 + ((S[5] >> 0xe | S[5] << 0x32) ^ (S[5] >> 0x12 | S[5] << 0x2e) ^
                    (S[5] >> 0x29 | S[5] * 0x800000)) + (W[0x4f] ^ S[5] & (S[6] ^ W[0x4f])) +
            K[local_2ec + 6] + W[(long)(local_2ec + 6) + -1];
    S[4] = lVar1 + uVar7;
    S[0] = lVar1 + ((S[1] >> 0x1c | S[1] << 0x24) ^ (S[1] >> 0x22 | S[1] * 0x40000000) ^
                   (S[1] >> 0x27 | S[1] * 0x2000000)) + ((S[1] | S[2]) & uVar8 | S[1] & S[2]);
    lVar1 = W[0x4f] + ((S[4] >> 0xe | S[4] << 0x32) ^ (S[4] >> 0x12 | S[4] << 0x2e) ^
                      (S[4] >> 0x29 | S[4] * 0x800000)) + (S[6] ^ S[4] & (S[5] ^ S[6])) +
            K[local_2ec + 7] + W[(long)(local_2ec + 7) + -1];
    S[3] = lVar1 + uVar8;
    W[0x4f] = lVar1 + ((S[0] >> 0x1c | S[0] << 0x24) ^ (S[0] >> 0x22 | S[0] * 0x40000000) ^
                      (S[0] >> 0x27 | S[0] * 0x2000000)) + ((S[0] | S[1]) & S[2] | S[0] & S[1]);
  }
  for (local_2ec = 0; local_2ec < 8; local_2ec = local_2ec + 1) {
    md->state[local_2ec] = md->state[local_2ec] + W[(long)local_2ec + 0x4f];
  }
  return 0;
}

Assistant:

static int s_sha512_compress(struct sha512_state * md, const unsigned char *buf)
{
    ulong64 S[8], W[80], t0, t1;
    int i;

    /* copy state into S */
    for (i = 0; i < 8; i++) {
        S[i] = md->state[i];
    }

    /* copy the state into 1024-bits into W[0..15] */
    for (i = 0; i < 16; i++) {
        LOAD64H(W[i], buf + (8*i));
    }

    /* fill W[16..79] */
    for (i = 16; i < 80; i++) {
        W[i] = Gamma1(W[i - 2]) + W[i - 7] + Gamma0(W[i - 15]) + W[i - 16];
    }

    /* Compress */
#define RND(a,b,c,d,e,f,g,h,i)                         \
     t0 = h + Sigma1(e) + Ch(e, f, g) + K[i] + W[i];   \
     t1 = Sigma0(a) + Maj(a, b, c);                    \
     d += t0;                                          \
     h  = t0 + t1;

    for (i = 0; i < 80; i += 8) {
        RND(S[0],S[1],S[2],S[3],S[4],S[5],S[6],S[7],i+0);
        RND(S[7],S[0],S[1],S[2],S[3],S[4],S[5],S[6],i+1);
        RND(S[6],S[7],S[0],S[1],S[2],S[3],S[4],S[5],i+2);
        RND(S[5],S[6],S[7],S[0],S[1],S[2],S[3],S[4],i+3);
        RND(S[4],S[5],S[6],S[7],S[0],S[1],S[2],S[3],i+4);
        RND(S[3],S[4],S[5],S[6],S[7],S[0],S[1],S[2],i+5);
        RND(S[2],S[3],S[4],S[5],S[6],S[7],S[0],S[1],i+6);
        RND(S[1],S[2],S[3],S[4],S[5],S[6],S[7],S[0],i+7);
    }

    /* feedback */
    for (i = 0; i < 8; i++) {
        md->state[i] = md->state[i] + S[i];
    }

    return 0;
}